

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *this_00;
  cmCTestTestProperties *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  reference ppVar5;
  reference pbVar6;
  ostream *poVar7;
  void *this_01;
  char *pcVar8;
  string local_14a0 [32];
  ostringstream local_1480 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1308 [32];
  ostringstream local_12e8 [8];
  ostringstream cmCTestLog_msg_8;
  string local_1170 [32];
  undefined1 local_1150 [8];
  ostringstream cmCTestLog_msg_7;
  string local_fd8 [32];
  undefined1 local_fb8 [8];
  ostringstream cmCTestLog_msg_6;
  string local_e40 [32];
  string local_e20 [36];
  int local_dfc;
  undefined1 local_df8 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_c80 [8];
  ostringstream indexStr;
  string local_b08 [32];
  undefined1 local_ae8 [8];
  ostringstream cmCTestLog_msg_4;
  string local_970 [32];
  undefined1 local_950 [8];
  ostringstream cmCTestLog_msg_3;
  string local_7d8 [32];
  ostringstream local_7b8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_640 [32];
  undefined1 local_620 [8];
  ostringstream cmCTestLog_msg_1;
  string *label;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_468 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_2e0 [8];
  cmCTestRunTest testRun;
  cmWorkingDirectory workdir;
  cmCTestTestProperties *p;
  pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *it;
  iterator __end1;
  iterator __begin1;
  PropertiesMap *__range1;
  cmCTestMultiProcessHandler *this_local;
  
  bVar3 = cmCTest::GetOutputAsJson(this->CTest);
  if (bVar3) {
    PrintOutputAsJson(this);
  }
  else {
    this_00 = this->TestHandler;
    iVar4 = FindMaxIndex(this);
    cmCTestTestHandler::SetMaxIndex(this_00,iVar4);
    __end1 = std::
             map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
             ::begin(&(this->Properties).
                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    );
    it = (pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*> *)
         std::
         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
         ::end(&(this->Properties).
                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              );
    while( true ) {
      bVar3 = std::operator!=(&__end1,(_Self *)&it);
      if (!bVar3) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>
               ::operator*(&__end1);
      pcVar1 = ppVar5->second;
      cmWorkingDirectory::cmWorkingDirectory
                ((cmWorkingDirectory *)&testRun.TotalNumberOfTests,&pcVar1->Directory);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_2e0,this,pcVar1->Index);
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_2e0);
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar1->Labels);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
        std::operator<<((ostream *)local_468,"Labels:");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x57b,pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
      }
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pcVar1->Labels);
      label = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&pcVar1->Labels);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&label);
        if (!bVar3) break;
        pbVar6 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
        poVar7 = std::operator<<((ostream *)local_620," ");
        std::operator<<(poVar7,(string *)pbVar6);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x57f,pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_640);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar1->Labels);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_7b8);
        std::ostream::operator<<(local_7b8,std::endl<char,std::char_traits<char>>);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x584,pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_7d8);
        std::__cxx11::ostringstream::~ostringstream(local_7b8);
      }
      if ((this->TestHandler->MemCheck & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ae8);
        std::operator<<((ostream *)local_ae8,"  Test");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x58b,pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_b08);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ae8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_950);
        std::operator<<((ostream *)local_950,"  Memory Check");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x589,pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_970);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_950);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c80);
      poVar7 = std::operator<<((ostream *)local_c80," #");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pcVar1->Index);
      std::operator<<(poVar7,":");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_df8);
      iVar4 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
      iVar4 = getNumWidth((long)iVar4);
      local_dfc = (int)std::setw(iVar4 + 3);
      poVar7 = std::operator<<((ostream *)local_df8,(_Setw)local_dfc);
      std::__cxx11::ostringstream::str();
      std::operator<<(poVar7,local_e20);
      std::__cxx11::string::~string(local_e20);
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x593,pcVar8,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_e40);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_df8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fb8);
      poVar7 = std::operator<<((ostream *)local_fb8," ");
      std::operator<<(poVar7,(string *)&pcVar1->Name);
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x595,pcVar8,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_fd8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fb8);
      if ((pcVar1->Disabled & 1U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1150);
        std::operator<<((ostream *)local_1150," (Disabled)");
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x598,pcVar8,(bool)(this->Quiet & 1));
        std::__cxx11::string::~string(local_1170);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1150);
      }
      std::__cxx11::ostringstream::ostringstream(local_12e8);
      std::ostream::operator<<(local_12e8,std::endl<char,std::char_traits<char>>);
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x59a,pcVar8,(bool)(this->Quiet & 1));
      std::__cxx11::string::~string(local_1308);
      std::__cxx11::ostringstream::~ostringstream(local_12e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c80);
      cmCTestRunTest::~cmCTestRunTest((cmCTestRunTest *)local_2e0);
      cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)&testRun.TotalNumberOfTests);
      std::_Rb_tree_iterator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>::
      operator++(&__end1);
    }
    std::__cxx11::ostringstream::ostringstream(local_1480);
    poVar7 = (ostream *)std::ostream::operator<<(local_1480,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<(poVar7,"Total Tests: ");
    this_01 = (void *)std::ostream::operator<<(poVar7,this->Total);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x5a0,pcVar8,(bool)(this->Quiet & 1));
    std::__cxx11::string::~string(local_14a0);
    std::__cxx11::ostringstream::~ostringstream(local_1480);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  if (this->CTest->GetOutputAsJson()) {
    this->PrintOutputAsJson();
    return;
  }

  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);

    cmCTestRunTest testRun(*this, p.Index);
    testRun.ComputeArguments(); // logs the command in verbose mode

    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Labels:", this->Quiet);
    }
    for (std::string const& label : p.Labels) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << label,
                         this->Quiet);
    }
    if (!p.Labels.empty()) // print the labels
    {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                         this->Quiet);
    }

    if (this->TestHandler->MemCheck) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
                         this->Quiet);
    } else {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
    }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(
      this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
        << indexStr.str(),
      this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " " << p.Name,
                       this->Quiet);
    if (p.Disabled) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " (Disabled)",
                         this->Quiet);
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl, this->Quiet);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     std::endl
                       << "Total Tests: " << this->Total << std::endl,
                     this->Quiet);
}